

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O2

ssize_t __thiscall Flasher::read(Flasher *this,int __fd,void *__buf,size_t __nbytes)

{
  _func_int *p_Var1;
  FlasherObserver *pFVar2;
  Flash *pFVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  FILE *pFVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  undefined8 *puVar12;
  undefined4 extraout_var;
  int *piVar13;
  Flasher *pFVar14;
  undefined4 in_register_00000034;
  pointer_____offset_0x10___ *ppuVar15;
  ulong uVar16;
  ulong uVar17;
  ulong __n;
  size_t sStack_60;
  Flasher *local_58;
  ulong local_50;
  uint local_44;
  ulong local_40;
  FILE *local_38;
  
  local_38 = (FILE *)CONCAT44(in_register_00000034,__fd);
  uVar16 = (ulong)__buf & 0xffffffff;
  sStack_60 = 0x109bb1;
  uVar8 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[3])();
  __n = (ulong)uVar8;
  lVar6 = -((ulong)uVar8 + 0xf & 0xfffffffffffffff0);
  local_40 = (__nbytes & 0xffffffff) / __n;
  if ((int)((__nbytes & 0xffffffff) % __n) == 0) {
    p_Var1 = ((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
              super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
              super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[6];
    *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109be8;
    uVar9 = (*p_Var1)();
    if ((uint)__nbytes < uVar9) {
      if ((int)__buf == 0) {
        p_Var1 = ((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                  _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                  super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[4];
        *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109c03;
        iVar10 = (*p_Var1)();
        uVar16 = (ulong)((iVar10 - (int)local_40) * uVar8);
      }
      uVar4 = ((uVar8 + (int)uVar16) - 1) / __n;
      iVar10 = (int)local_40;
      uVar8 = (uint)uVar4;
      p_Var1 = ((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[4];
      local_58 = this;
      local_50 = uVar16;
      *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109c3c;
      uVar9 = (*p_Var1)();
      pFVar7 = local_38;
      if (iVar10 + uVar8 <= uVar9) {
        *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109c54;
        local_38 = fopen((char *)pFVar7,"wb");
        uVar16 = local_50;
        pFVar14 = local_58;
        if (local_38 == (FILE *)0x0) {
          *(undefined8 *)((long)&sStack_60 + lVar6) = 0x10;
          uVar5 = *(undefined8 *)((long)&sStack_60 + lVar6);
          *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109d8b;
          puVar12 = (undefined8 *)__cxa_allocate_exception(uVar5);
          *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109d93;
          piVar13 = __errno_location();
          iVar10 = *piVar13;
          *puVar12 = &PTR__exception_001173b0;
          *(int *)(puVar12 + 1) = iVar10;
          *(undefined1 **)((long)&sStack_60 + lVar6) = &LAB_00109db8;
          __cxa_throw(puVar12,&FileOpenError::typeinfo,std::exception::~exception);
        }
        pFVar2 = local_58->_observer;
        uVar17 = 0;
        p_Var1 = pFVar2->_vptr_FlasherObserver[2];
        *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109c7f;
        (*p_Var1)(pFVar2,"Read %d bytes from flash\n",uVar16);
        local_44 = uVar8 - 1;
        do {
          pFVar2 = pFVar14->_observer;
          p_Var1 = pFVar2->_vptr_FlasherObserver[3];
          uVar9 = (uint)uVar17;
          if (uVar8 <= uVar9) {
            *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109d28;
            (*p_Var1)(pFVar2,uVar4,uVar4);
            pFVar7 = local_38;
            *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109d31;
            iVar10 = fclose(pFVar7);
            return CONCAT44(extraout_var,iVar10);
          }
          *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109ca2;
          (*p_Var1)(pFVar2,uVar17,uVar4);
          pFVar3 = (pFVar14->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>
                   ._M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                   super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
          iVar10 = (int)local_40;
          p_Var1 = pFVar3->_vptr_Flash[0x19];
          *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109cbd;
          (*p_Var1)(pFVar3,(ulong)(uVar9 + iVar10),(void *)((long)&local_58 + lVar6));
          if ((local_44 == uVar9) && (uVar16 = (local_50 & 0xffffffff) % __n, (int)uVar16 != 0)) {
            __n = uVar16;
          }
          *(undefined8 *)((long)&sStack_60 + lVar6) = 1;
          pFVar7 = local_38;
          sVar11 = *(size_t *)((long)&sStack_60 + lVar6);
          *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109ce7;
          sVar11 = fwrite((void *)((long)&local_58 + lVar6),sVar11,__n,pFVar7);
          uVar17 = (ulong)(uVar9 + 1);
          pFVar14 = local_58;
        } while (sVar11 == __n);
        *(undefined8 *)((long)&sStack_60 + lVar6) = 8;
        uVar5 = *(undefined8 *)((long)&sStack_60 + lVar6);
        *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109cfb;
        puVar12 = (undefined8 *)__cxa_allocate_exception(uVar5);
        *puVar12 = &PTR__exception_00117428;
        *(undefined1 **)((long)&sStack_60 + lVar6) = &LAB_00109d1b;
        __cxa_throw(puVar12,&FileShortError::typeinfo,std::exception::~exception);
      }
      *(undefined8 *)((long)&sStack_60 + lVar6) = 8;
      uVar5 = *(undefined8 *)((long)&sStack_60 + lVar6);
      *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109d63;
      puVar12 = (undefined8 *)__cxa_allocate_exception(uVar5);
      *puVar12 = &PTR__exception_00117400;
      ppuVar15 = &FileSizeError::typeinfo;
      goto LAB_00109d74;
    }
  }
  *(undefined8 *)((long)&sStack_60 + lVar6) = 8;
  uVar5 = *(undefined8 *)((long)&sStack_60 + lVar6);
  *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109d48;
  puVar12 = (undefined8 *)__cxa_allocate_exception(uVar5);
  *puVar12 = &PTR__exception_00117388;
  ppuVar15 = &FlashOffsetError::typeinfo;
LAB_00109d74:
  *(undefined8 *)((long)&sStack_60 + lVar6) = 0x109d83;
  __cxa_throw(puVar12,ppuVar15,std::exception::~exception);
}

Assistant:

void
Flasher::read(const char* filename, uint32_t fsize, uint32_t foffset)
{
    FILE* outfile;
    uint32_t pageSize = _flash->pageSize();
    uint8_t buffer[pageSize];
    uint32_t pageNum = 0;
    uint32_t pageOffset;
    uint32_t numPages;
    size_t fbytes;

    if (foffset % pageSize != 0 || foffset >= _flash->totalSize())
        throw FlashOffsetError();
        
    pageOffset = foffset / pageSize;

    if (fsize == 0)
        fsize = pageSize * (_flash->numPages() - pageOffset);

    numPages = (fsize + pageSize - 1) / pageSize;
    if (pageOffset + numPages > _flash->numPages())
        throw FileSizeError();
    
    outfile = fopen(filename, "wb");
    if (!outfile)
        throw FileOpenError(errno);
    
    _observer.onStatus("Read %d bytes from flash\n", fsize);
    
    try
    {
        for (pageNum = 0; pageNum < numPages; pageNum++)
        {
            _observer.onProgress(pageNum, numPages);

            _flash->readPage(pageOffset + pageNum, buffer);

            if (pageNum == numPages - 1 && fsize % pageSize > 0)
                pageSize = fsize % pageSize;
            fbytes = fwrite(buffer, 1, pageSize, outfile);
            if (fbytes != pageSize)
                throw FileShortError();
        }
    }
    catch(...)
    {
        fclose(outfile);
        throw;
    }
    
    _observer.onProgress(numPages, numPages);
    
    fclose(outfile);
}